

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void vsencoding::__vseblocks_unpack1(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint32_t bs_local;
  uint32_t *in_local;
  uint32_t *out_local;
  
  in_local = in;
  out_local = out;
  for (bs_local = bs + 0x1f >> 5; bs_local != 0; bs_local = bs_local - 1) {
    *out_local = *in_local >> 0x1f;
    out_local[1] = *in_local >> 0x1e & 1;
    out_local[2] = *in_local >> 0x1d & 1;
    out_local[3] = *in_local >> 0x1c & 1;
    out_local[4] = *in_local >> 0x1b & 1;
    out_local[5] = *in_local >> 0x1a & 1;
    out_local[6] = *in_local >> 0x19 & 1;
    out_local[7] = *in_local >> 0x18 & 1;
    out_local[8] = *in_local >> 0x17 & 1;
    out_local[9] = *in_local >> 0x16 & 1;
    out_local[10] = *in_local >> 0x15 & 1;
    out_local[0xb] = *in_local >> 0x14 & 1;
    out_local[0xc] = *in_local >> 0x13 & 1;
    out_local[0xd] = *in_local >> 0x12 & 1;
    out_local[0xe] = *in_local >> 0x11 & 1;
    out_local[0xf] = *in_local >> 0x10 & 1;
    out_local[0x10] = *in_local >> 0xf & 1;
    out_local[0x11] = *in_local >> 0xe & 1;
    out_local[0x12] = *in_local >> 0xd & 1;
    out_local[0x13] = *in_local >> 0xc & 1;
    out_local[0x14] = *in_local >> 0xb & 1;
    out_local[0x15] = *in_local >> 10 & 1;
    out_local[0x16] = *in_local >> 9 & 1;
    out_local[0x17] = *in_local >> 8 & 1;
    out_local[0x18] = *in_local >> 7 & 1;
    out_local[0x19] = *in_local >> 6 & 1;
    out_local[0x1a] = *in_local >> 5 & 1;
    out_local[0x1b] = *in_local >> 4 & 1;
    out_local[0x1c] = *in_local >> 3 & 1;
    out_local[0x1d] = *in_local >> 2 & 1;
    out_local[0x1e] = *in_local >> 1 & 1;
    out_local[0x1f] = *in_local & 1;
    out_local = out_local + 0x20;
    in_local = in_local + 1;
  }
  return;
}

Assistant:

void __vseblocks_unpack1(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  // for (uint32_t i = 0; i < bs; i += 32, out += 32, in += 1) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 1,
      --bs) { // remove inf-loop gcc warning (ovflw-related)
    out[0] = in[0] >> 31;
    out[1] = (in[0] >> 30) & 0x01;
    out[2] = (in[0] >> 29) & 0x01;
    out[3] = (in[0] >> 28) & 0x01;
    out[4] = (in[0] >> 27) & 0x01;
    out[5] = (in[0] >> 26) & 0x01;
    out[6] = (in[0] >> 25) & 0x01;
    out[7] = (in[0] >> 24) & 0x01;
    out[8] = (in[0] >> 23) & 0x01;
    out[9] = (in[0] >> 22) & 0x01;
    out[10] = (in[0] >> 21) & 0x01;
    out[11] = (in[0] >> 20) & 0x01;
    out[12] = (in[0] >> 19) & 0x01;
    out[13] = (in[0] >> 18) & 0x01;
    out[14] = (in[0] >> 17) & 0x01;
    out[15] = (in[0] >> 16) & 0x01;
    out[16] = (in[0] >> 15) & 0x01;
    out[17] = (in[0] >> 14) & 0x01;
    out[18] = (in[0] >> 13) & 0x01;
    out[19] = (in[0] >> 12) & 0x01;
    out[20] = (in[0] >> 11) & 0x01;
    out[21] = (in[0] >> 10) & 0x01;
    out[22] = (in[0] >> 9) & 0x01;
    out[23] = (in[0] >> 8) & 0x01;
    out[24] = (in[0] >> 7) & 0x01;
    out[25] = (in[0] >> 6) & 0x01;
    out[26] = (in[0] >> 5) & 0x01;
    out[27] = (in[0] >> 4) & 0x01;
    out[28] = (in[0] >> 3) & 0x01;
    out[29] = (in[0] >> 2) & 0x01;
    out[30] = (in[0] >> 1) & 0x01;
    out[31] = in[0] & 0x01;
  }
}